

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O3

void __thiscall
highwayhash::HighwayHashTest<1U>::operator()
          (HighwayHashTest<1U> *this,HHKey *key,char *bytes,size_t size,HHResult64 *expected,
          HHNotify notify)

{
  uint64_t *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  long lVar11;
  char *pcVar12;
  Lanes rotated_keys;
  HHStateT<1U> state;
  undefined8 local_c8;
  uint auStack_c0 [8];
  HHStatePortable local_a0;
  
  lVar11 = 0;
  do {
    puVar1 = *key + lVar11;
    uVar9 = *puVar1;
    uVar10 = puVar1[1];
    uVar3 = *(uint *)((long)puVar1 + 0xc);
    auStack_c0[lVar11 * 2 + -2] = *(uint *)((long)puVar1 + 4);
    auStack_c0[lVar11 * 2 + -1] = (uint)uVar9;
    auStack_c0[lVar11 * 2] = uVar3;
    *(uint *)((long)local_a0.v0 + lVar11 * 8 + -0x1c) = (uint)uVar10;
    lVar11 = lVar11 + 2;
  } while (lVar11 != 4);
  local_a0.mul0[2] = 0x13198a2e03707344;
  local_a0.mul0[3] = 0x243f6a8885a308d3;
  local_a0.mul0[0] = 0xdbe6d5d5fe4cce2f;
  local_a0.mul0[1] = 0xa4093822299f31d0;
  local_a0.mul1[0] = 0x3bd39e10cb0ef593;
  local_a0.mul1[1] = 0xc0acf169b5f18a8c;
  local_a0.mul1[2] = 0xbe5466cf34e90c6c;
  local_a0.mul1[3] = 0x452821e638d01377;
  lVar11 = 0;
  do {
    puVar2 = (uint *)((long)*key + lVar11);
    uVar3 = puVar2[1];
    uVar4 = puVar2[2];
    uVar5 = puVar2[3];
    uVar6 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar11 + 4);
    uVar7 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar11 + 8);
    uVar8 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar11 + 0xc);
    *(uint *)((long)local_a0.v0 + lVar11) =
         *puVar2 ^ *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar11)
    ;
    *(uint *)((long)local_a0.v0 + lVar11 + 4) = uVar3 ^ uVar6;
    *(uint *)((long)local_a0.v0 + lVar11 + 8) = uVar4 ^ uVar7;
    *(uint *)((long)local_a0.v0 + lVar11 + 0xc) = uVar5 ^ uVar8;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x20);
  lVar11 = 0;
  do {
    uVar3 = *(uint *)((long)auStack_c0 + lVar11 + -4);
    uVar4 = *(uint *)((long)auStack_c0 + lVar11);
    uVar5 = *(uint *)((long)auStack_c0 + lVar11 + 4);
    uVar6 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar11 + 4);
    uVar7 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar11 + 8);
    uVar8 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar11 + 0xc);
    *(uint *)((long)local_a0.v1 + lVar11) =
         *(uint *)((long)auStack_c0 + lVar11 + -8) ^
         *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar11);
    *(uint *)((long)local_a0.v1 + lVar11 + 4) = uVar3 ^ uVar6;
    *(uint *)((long)local_a0.v1 + lVar11 + 8) = uVar4 ^ uVar7;
    *(uint *)((long)local_a0.v1 + lVar11 + 0xc) = uVar5 ^ uVar8;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x20);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>(&local_a0,bytes,size,&local_c8)
  ;
  if (*expected != local_c8) {
    pcVar12 = TargetName(1);
    (*notify)(pcVar12,size);
  }
  return;
}

Assistant:

void HighwayHashTest<Target>::operator()(const HHKey& key,
                                         const char* HH_RESTRICT bytes,
                                         const size_t size,
                                         const HHResult64* expected,
                                         const HHNotify notify) const {
  HHStateT<Target> state(key);
  TestHighwayHash(&state, bytes, size, expected, notify);
}